

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_seq_executor.cpp
# Opt level: O0

void __thiscall KeySequentialExecutor::startWorkers(KeySequentialExecutor *this)

{
  int local_6c;
  pair<const_int,_unsigned_long> local_68 [2];
  string local_48;
  undefined1 local_28 [28];
  int i;
  KeySequentialExecutor *this_local;
  
  unique0x100000f8 = this;
  for (local_28._20_4_ = 0; (ulong)(long)(int)local_28._20_4_ < this->m_numThreads;
      local_28._20_4_ = local_28._20_4_ + 1) {
    std::__cxx11::to_string(&local_48,local_28._20_4_);
    std::make_shared<Worker,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
    std::vector<std::shared_ptr<Worker>,_std::allocator<std::shared_ptr<Worker>_>_>::push_back
              (&this->m_workers,(value_type *)local_28);
    std::shared_ptr<Worker>::~shared_ptr((shared_ptr<Worker> *)local_28);
    std::__cxx11::string::~string((string *)&local_48);
    local_6c = 0;
    std::pair<const_int,_unsigned_long>::pair<int_&,_int,_true>
              (local_68,(int *)(local_28 + 0x14),&local_6c);
    std::
    unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    ::insert(&this->m_stats,local_68);
  }
  return;
}

Assistant:

void KeySequentialExecutor::startWorkers()
{
    //std::cout << "Going to start workers : " << m_numThreads << std::endl;
    for(int i = 0; i < m_numThreads; ++i)
    {
        m_workers.push_back(std::make_shared<Worker>(std::to_string(i)));
        m_stats.insert({i, 0});
    }
}